

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

uint8_t __thiscall AmpIO::GetAmpTemperature(AmpIO *this,uint index)

{
  uint32_t uVar1;
  uint8_t local_15;
  uint8_t temp;
  uint index_local;
  AmpIO *this_local;
  
  local_15 = '\0';
  if (index == 0) {
    local_15 = (uint8_t)(this->ReadBuffer[3] >> 8);
  }
  else if (index == 1) {
    local_15 = (uint8_t)this->ReadBuffer[3];
  }
  else {
    uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar1 == 0x44514c41) {
      if (index == 2) {
        local_15 = (uint8_t)(this->ReadBuffer[3] >> 0x18);
      }
      else if (index == 3) {
        local_15 = (uint8_t)(this->ReadBuffer[3] >> 0x10);
      }
    }
  }
  return local_15;
}

Assistant:

uint8_t AmpIO::GetAmpTemperature(unsigned int index) const
{
    uint8_t temp = 0;
    if (index == 0)
        temp = (ReadBuffer[TEMP_OFFSET]>>8) & 0x000000ff;
    else if (index == 1)
        temp = ReadBuffer[TEMP_OFFSET] & 0x000000ff;
    else if (GetHardwareVersion() == DQLA_String) {
        if (index == 2)
            temp = (ReadBuffer[TEMP_OFFSET]>>24) & 0x000000ff;
        else if (index == 3)
            temp = (ReadBuffer[TEMP_OFFSET]>>16) & 0x000000ff;
    }
    return temp;
}